

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O3

CubicSplinePtr __thiscall OpenMD::EAMAdapter::getFSpline(EAMAdapter *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  EAMAdapter *in_RSI;
  int iVar2;
  CubicSplinePtr CVar3;
  vector<double,_std::allocator<double>_> rhovals;
  FuncflParameters funcflParam;
  vector<double,_std::allocator<double>_> local_d8;
  double local_b8;
  double local_b0;
  FuncflParameters local_a8;
  
  getFuncflParam(&local_a8,in_RSI);
  local_b0 = local_a8.drho;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  if (0 < local_a8.nrho) {
    iVar2 = 0;
    do {
      local_b8 = (double)iVar2 * local_b0;
      if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_d8,
                   (iterator)
                   local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_b8);
      }
      else {
        *local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_b8;
        local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      iVar2 = iVar2 + 1;
    } while (local_a8.nrho != iVar2);
  }
  this->at_ = (AtomType *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::CubicSpline,std::allocator<OpenMD::CubicSpline>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 1),(CubicSpline **)this,
             (allocator<OpenMD::CubicSpline> *)&local_b8);
  CubicSpline::addPoints((CubicSpline *)this->at_,&local_d8,&local_a8.F);
  _Var1._M_pi = extraout_RDX;
  if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    _Var1._M_pi = extraout_RDX_00;
  }
  if (local_a8.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_a8.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.F.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    _Var1._M_pi = extraout_RDX_01;
  }
  if (local_a8.rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.rho.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    _Var1._M_pi = extraout_RDX_02;
  }
  if (local_a8.Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_a8.Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.Z.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    _Var1._M_pi = extraout_RDX_03;
  }
  CVar3.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  CVar3.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (CubicSplinePtr)CVar3.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CubicSplinePtr EAMAdapter::getFSpline() {
    FuncflParameters funcflParam = getFuncflParam();
    int nrho                     = funcflParam.nrho;
    RealType drho                = funcflParam.drho;
    std::vector<RealType> rhovals;

    for (int i = 0; i < nrho; i++) {
      rhovals.push_back(RealType(i) * drho);
    }

    CubicSplinePtr cs {std::make_shared<CubicSpline>()};
    cs->addPoints(rhovals, funcflParam.F);
    return cs;
  }